

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XercesXPath.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::XercesXPath::parseExpression
          (XercesXPath *this,XMLStringPool *stringPool,XercesNamespaceResolver *scopeContext)

{
  uint uVar1;
  BaseRefVectorOf<xercesc_4_0::XercesLocationPath> *pBVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  XMLSize_t XVar9;
  undefined4 extraout_var;
  RefVectorOf<xercesc_4_0::XercesLocationPath> *this_00;
  int *piVar10;
  undefined4 extraout_var_00;
  uint *puVar11;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  XercesNodeTest *pXVar12;
  XercesStep *pXVar13;
  undefined4 extraout_var_03;
  XercesLocationPath *pXVar14;
  XercesLocationPath *pXVar15;
  XPathException *pXVar16;
  XMLCh *pXVar17;
  XMLSize_t getAt;
  ulong uVar18;
  XMLSize_t getAt_00;
  XMLSize_t i;
  BaseRefVectorOf<xercesc_4_0::XercesStep> *local_140;
  ValueVectorOf<int> tokens;
  QName aQName;
  XPathScannerForSchema scanner;
  
  XVar9 = XMLString::stringLen(this->fExpression);
  if (XVar9 != 0) {
    tokens.fMemoryManager = this->fMemoryManager;
    tokens.fCallDestructor = false;
    tokens.fCurCount = 0;
    tokens.fMaxCount = 0x10;
    tokens.fElemList = (int *)0x0;
    iVar6 = (*(tokens.fMemoryManager)->_vptr_MemoryManager[3])(tokens.fMemoryManager,0x40);
    tokens.fElemList = (int *)CONCAT44(extraout_var,iVar6);
    tokens.fElemList[0] = 0;
    tokens.fElemList[1] = 0;
    tokens.fElemList[2] = 0;
    tokens.fElemList[3] = 0;
    tokens.fElemList[4] = 0;
    tokens.fElemList[5] = 0;
    tokens.fElemList[6] = 0;
    tokens.fElemList[7] = 0;
    tokens.fElemList[8] = 0;
    tokens.fElemList[9] = 0;
    tokens.fElemList[10] = 0;
    tokens.fElemList[0xb] = 0;
    tokens.fElemList[0xc] = 0;
    tokens.fElemList[0xd] = 0;
    tokens.fElemList[0xe] = 0;
    tokens.fElemList[0xf] = 0;
    XPathScannerForSchema::XPathScannerForSchema(&scanner,stringPool);
    bVar5 = XPathScanner::scanExpression
                      (&scanner.super_XPathScanner,this->fExpression,0,XVar9,&tokens);
    XVar9 = tokens.fCurCount;
    if (!bVar5) {
      pXVar16 = (XPathException *)__cxa_allocate_exception(0x30);
      XPathException::XPathException
                (pXVar16,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/identity/XercesXPath.cpp"
                 ,0x18a,XPath_TokenNotSupported,this->fMemoryManager);
      __cxa_throw(pXVar16,&XPathException::typeinfo,XMLException::~XMLException);
    }
    local_140 = (BaseRefVectorOf<xercesc_4_0::XercesStep> *)
                XMemory::operator_new(0x30,this->fMemoryManager);
    RefVectorOf<xercesc_4_0::XercesStep>::RefVectorOf
              ((RefVectorOf<xercesc_4_0::XercesStep> *)local_140,0x10,true,this->fMemoryManager);
    if (XVar9 != 0) {
      this_00 = (RefVectorOf<xercesc_4_0::XercesLocationPath> *)
                XMemory::operator_new(0x30,this->fMemoryManager);
      RefVectorOf<xercesc_4_0::XercesLocationPath>::RefVectorOf(this_00,8,true,this->fMemoryManager)
      ;
      this->fLocationPaths = this_00;
    }
    bVar5 = true;
    getAt = 0;
    while (getAt < XVar9) {
      piVar10 = ValueVectorOf<int>::elementAt(&tokens,getAt);
      iVar6 = *piVar10;
      bVar3 = false;
      getAt_00 = getAt;
      uVar18 = getAt;
      bVar4 = false;
      switch(iVar6) {
      case 4:
        pXVar12 = (XercesNodeTest *)XMemory::operator_new(0x18,this->fMemoryManager);
        XercesNodeTest::XercesNodeTest(pXVar12,3,this->fMemoryManager);
        pXVar13 = (XercesStep *)XMemory::operator_new(0x18,this->fMemoryManager);
        XercesStep::XercesStep(pXVar13,3,pXVar12);
        BaseRefVectorOf<xercesc_4_0::XercesStep>::addElement(local_140,pXVar13);
        if (((bVar5) && (uVar18 = getAt + 1, uVar18 < XVar9)) &&
           (piVar10 = ValueVectorOf<int>::elementAt(&tokens,uVar18), *piVar10 == 0x16)) {
          if (getAt == XVar9 - 2) {
            pXVar16 = (XPathException *)__cxa_allocate_exception(0x30);
            XPathException::XPathException
                      (pXVar16,
                       "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/identity/XercesXPath.cpp"
                       ,0x25e,XPath_ExpectedStep2,this->fMemoryManager);
LAB_00304838:
            __cxa_throw(pXVar16,&XPathException::typeinfo,XMLException::~XMLException);
          }
          if ((getAt + 2 < XVar9) &&
             (piVar10 = ValueVectorOf<int>::elementAt(&tokens,getAt + 2), *piVar10 == 0x15)) {
            pXVar16 = (XPathException *)__cxa_allocate_exception(0x30);
            XPathException::XPathException
                      (pXVar16,
                       "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/identity/XercesXPath.cpp"
                       ,0x266,XPath_NoForwardSlash,this->fMemoryManager);
            goto LAB_00304838;
          }
          pXVar12 = (XercesNodeTest *)XMemory::operator_new(0x18,this->fMemoryManager);
          XercesNodeTest::XercesNodeTest(pXVar12,3,this->fMemoryManager);
          pXVar13 = (XercesStep *)XMemory::operator_new(0x18,this->fMemoryManager);
          XercesStep::XercesStep(pXVar13,4,pXVar12);
          BaseRefVectorOf<xercesc_4_0::XercesStep>::addElement(local_140,pXVar13);
          getAt = uVar18;
        }
        goto LAB_003042c8;
      case 5:
      case 7:
      case 0xc:
      case 0xd:
      case 0xe:
      case 0xf:
      case 0x10:
      case 0x11:
      case 0x12:
      case 0x13:
      case 0x14:
        break;
      case 6:
switchD_00303cdd_caseD_6:
        if (uVar18 == XVar9 - 1) {
          pXVar16 = (XPathException *)__cxa_allocate_exception(0x30);
          XPathException::XPathException
                    (pXVar16,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/identity/XercesXPath.cpp"
                     ,0x1c9,XPath_MissingAttr,this->fMemoryManager);
          goto LAB_00304710;
        }
        getAt = uVar18 + 1;
        piVar10 = ValueVectorOf<int>::elementAt(&tokens,getAt);
        iVar6 = *piVar10;
        if (iVar6 == 9) {
          pXVar12 = (XercesNodeTest *)XMemory::operator_new(0x18,this->fMemoryManager);
          XercesNodeTest::XercesNodeTest(pXVar12,2,this->fMemoryManager);
          pXVar13 = (XercesStep *)XMemory::operator_new(0x18,this->fMemoryManager);
          XercesStep::XercesStep(pXVar13,2,pXVar12);
          BaseRefVectorOf<xercesc_4_0::XercesStep>::addElement(local_140,pXVar13);
        }
        else {
          if (iVar6 == 10) {
            bVar5 = true;
          }
          else {
            if (iVar6 != 0xb) {
              pXVar16 = (XPathException *)__cxa_allocate_exception(0x30);
              XPathException::XPathException
                        (pXVar16,
                         "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/identity/XercesXPath.cpp"
                         ,0x1d1,XPath_ExpectedToken1,this->fMemoryManager);
              goto LAB_00304710;
            }
            bVar5 = false;
          }
          getAt = uVar18 + 2;
          puVar11 = (uint *)ValueVectorOf<int>::elementAt(&tokens,getAt);
          uVar1 = *puVar11;
          uVar8 = this->fEmptyNamespaceId;
          uVar7 = uVar8;
          if (scopeContext == (XercesNamespaceResolver *)0x0) {
            pXVar17 = L"";
          }
          else {
            pXVar17 = L"";
            if (uVar1 != 0xffffffff) {
              iVar6 = (*(stringPool->super_XSerializable)._vptr_XSerializable[10])
                                (stringPool,(ulong)uVar1);
              pXVar17 = (XMLCh *)CONCAT44(extraout_var_01,iVar6);
              uVar7 = (**scopeContext->_vptr_XercesNamespaceResolver)(scopeContext,pXVar17);
              uVar8 = this->fEmptyNamespaceId;
            }
          }
          if (((scopeContext != (XercesNamespaceResolver *)0x0) && (uVar1 != 0xffffffff)) &&
             (uVar7 == uVar8)) {
            pXVar16 = (XPathException *)__cxa_allocate_exception(0x30);
            XPathException::XPathException
                      (pXVar16,
                       "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/identity/XercesXPath.cpp"
                       ,0x1f1,XPath_PrefixNoURI,pXVar17,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
                       this->fMemoryManager);
            __cxa_throw(pXVar16,&XPathException::typeinfo,XMLException::~XMLException);
          }
          if (!bVar5) {
            puVar11 = (uint *)ValueVectorOf<int>::elementAt(&tokens,uVar18 + 3);
            iVar6 = (*(stringPool->super_XSerializable)._vptr_XSerializable[10])
                              (stringPool,(ulong)*puVar11);
            QName::QName(&aQName,pXVar17,(XMLCh *)CONCAT44(extraout_var_03,iVar6),uVar7,
                         this->fMemoryManager);
            pXVar12 = (XercesNodeTest *)XMemory::operator_new(0x18,this->fMemoryManager);
            XercesNodeTest::XercesNodeTest(pXVar12,&aQName);
            pXVar13 = (XercesStep *)XMemory::operator_new(0x18,this->fMemoryManager);
            XercesStep::XercesStep(pXVar13,2,pXVar12);
            BaseRefVectorOf<xercesc_4_0::XercesStep>::addElement(local_140,pXVar13);
            QName::~QName(&aQName);
            getAt_00 = uVar18 + 3;
            bVar4 = false;
            break;
          }
          pXVar12 = (XercesNodeTest *)XMemory::operator_new(0x18,this->fMemoryManager);
          XercesNodeTest::XercesNodeTest(pXVar12,pXVar17,uVar7,this->fMemoryManager);
          pXVar13 = (XercesStep *)XMemory::operator_new(0x18,this->fMemoryManager);
          XercesStep::XercesStep(pXVar13,2,pXVar12);
          BaseRefVectorOf<xercesc_4_0::XercesStep>::addElement(local_140,pXVar13);
        }
        goto LAB_003042c8;
      case 8:
        pXVar16 = (XPathException *)__cxa_allocate_exception(0x30);
        XPathException::XPathException
                  (pXVar16,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/identity/XercesXPath.cpp"
                   ,0x210,XPath_NoDoubleColon,this->fMemoryManager);
        goto LAB_00304710;
      case 9:
        pXVar12 = (XercesNodeTest *)XMemory::operator_new(0x18,this->fMemoryManager);
        XercesNodeTest::XercesNodeTest(pXVar12,2,this->fMemoryManager);
        pXVar13 = (XercesStep *)XMemory::operator_new(0x18,this->fMemoryManager);
        XercesStep::XercesStep(pXVar13,1,pXVar12);
        BaseRefVectorOf<xercesc_4_0::XercesStep>::addElement(local_140,pXVar13);
LAB_003042c8:
        getAt_00 = getAt;
        bVar4 = false;
        break;
      case 10:
        bVar3 = true;
      case 0xb:
        getAt_00 = getAt + 1;
        puVar11 = (uint *)ValueVectorOf<int>::elementAt(&tokens,getAt_00);
        uVar1 = *puVar11;
        uVar8 = this->fEmptyNamespaceId;
        uVar7 = uVar8;
        if (scopeContext == (XercesNamespaceResolver *)0x0) {
          pXVar17 = L"";
        }
        else {
          pXVar17 = L"";
          if (uVar1 != 0xffffffff) {
            iVar6 = (*(stringPool->super_XSerializable)._vptr_XSerializable[10])
                              (stringPool,(ulong)uVar1);
            pXVar17 = (XMLCh *)CONCAT44(extraout_var_00,iVar6);
            uVar7 = (**scopeContext->_vptr_XercesNamespaceResolver)(scopeContext,pXVar17);
            uVar8 = this->fEmptyNamespaceId;
          }
        }
        if (((scopeContext != (XercesNamespaceResolver *)0x0) && (uVar1 != 0xffffffff)) &&
           (uVar7 == uVar8)) {
          pXVar16 = (XPathException *)__cxa_allocate_exception(0x30);
          XPathException::XPathException
                    (pXVar16,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/identity/XercesXPath.cpp"
                     ,0x239,XPath_PrefixNoURI,pXVar17,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
                     this->fMemoryManager);
          __cxa_throw(pXVar16,&XPathException::typeinfo,XMLException::~XMLException);
        }
        if (!bVar3) {
          getAt = getAt + 2;
          puVar11 = (uint *)ValueVectorOf<int>::elementAt(&tokens,getAt);
          iVar6 = (*(stringPool->super_XSerializable)._vptr_XSerializable[10])
                            (stringPool,(ulong)*puVar11);
          QName::QName(&aQName,pXVar17,(XMLCh *)CONCAT44(extraout_var_02,iVar6),uVar7,
                       this->fMemoryManager);
          pXVar12 = (XercesNodeTest *)XMemory::operator_new(0x18,this->fMemoryManager);
          XercesNodeTest::XercesNodeTest(pXVar12,&aQName);
          pXVar13 = (XercesStep *)XMemory::operator_new(0x18,this->fMemoryManager);
          XercesStep::XercesStep(pXVar13,1,pXVar12);
          BaseRefVectorOf<xercesc_4_0::XercesStep>::addElement(local_140,pXVar13);
          QName::~QName(&aQName);
          goto LAB_003042c8;
        }
        pXVar12 = (XercesNodeTest *)XMemory::operator_new(0x18,this->fMemoryManager);
        XercesNodeTest::XercesNodeTest(pXVar12,pXVar17,uVar7,this->fMemoryManager);
        pXVar13 = (XercesStep *)XMemory::operator_new(0x18,this->fMemoryManager);
        XercesStep::XercesStep(pXVar13,1,pXVar12);
        BaseRefVectorOf<xercesc_4_0::XercesStep>::addElement(local_140,pXVar13);
        bVar4 = bVar5;
        break;
      case 0x15:
        if (getAt == 0) {
          pXVar16 = (XPathException *)__cxa_allocate_exception(0x30);
          XPathException::XPathException
                    (pXVar16,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/identity/XercesXPath.cpp"
                     ,0x279,XPath_NoForwardSlashAtStart,this->fMemoryManager);
          goto LAB_00304710;
        }
        if (bVar5) {
          pXVar16 = (XPathException *)__cxa_allocate_exception(0x30);
          XPathException::XPathException
                    (pXVar16,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/identity/XercesXPath.cpp"
                     ,0x27e,XPath_NoSelectionOfRoot,this->fMemoryManager);
          goto LAB_00304710;
        }
        if (getAt == XVar9 - 1) {
          pXVar16 = (XPathException *)__cxa_allocate_exception(0x30);
          XPathException::XPathException
                    (pXVar16,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/identity/XercesXPath.cpp"
                     ,0x282,XPath_ExpectedStep3,this->fMemoryManager);
          goto LAB_00304710;
        }
        piVar10 = ValueVectorOf<int>::elementAt(&tokens,getAt + 1);
        if (*piVar10 - 0x15U < 3) {
          pXVar16 = (XPathException *)__cxa_allocate_exception(0x30);
          XPathException::XPathException
                    (pXVar16,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/identity/XercesXPath.cpp"
                     ,0x287,XPath_ExpectedStep3,this->fMemoryManager);
          goto LAB_00304710;
        }
LAB_00303e4e:
        getAt_00 = getAt;
        bVar4 = false;
        break;
      case 0x16:
        pXVar16 = (XPathException *)__cxa_allocate_exception(0x30);
        XPathException::XPathException
                  (pXVar16,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/identity/XercesXPath.cpp"
                   ,0x274,XPath_NoDoubleForwardSlash,this->fMemoryManager);
LAB_00304710:
        __cxa_throw(pXVar16,&XPathException::typeinfo,XMLException::~XMLException);
      case 0x17:
        if (getAt == 0) {
          pXVar16 = (XPathException *)__cxa_allocate_exception(0x30);
          XPathException::XPathException
                    (pXVar16,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/identity/XercesXPath.cpp"
                     ,0x19e,XPath_NoUnionAtStart,this->fMemoryManager);
          goto LAB_00304710;
        }
        if (local_140->fCurCount == 0) {
          pXVar16 = (XPathException *)__cxa_allocate_exception(0x30);
          XPathException::XPathException
                    (pXVar16,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/identity/XercesXPath.cpp"
                     ,0x1a4,XPath_NoMultipleUnion,this->fMemoryManager);
          __cxa_throw(pXVar16,&XPathException::typeinfo,XMLException::~XMLException);
        }
        pXVar13 = BaseRefVectorOf<xercesc_4_0::XercesStep>::elementAt(local_140,0);
        if (pXVar13->fAxisType != 3) {
          pXVar12 = (XercesNodeTest *)XMemory::operator_new(0x18,this->fMemoryManager);
          XercesNodeTest::XercesNodeTest(pXVar12,3,this->fMemoryManager);
          pXVar13 = (XercesStep *)XMemory::operator_new(0x18,this->fMemoryManager);
          XercesStep::XercesStep(pXVar13,3,pXVar12);
          BaseRefVectorOf<xercesc_4_0::XercesStep>::insertElementAt(local_140,pXVar13,0);
        }
        pXVar14 = (XercesLocationPath *)XMemory::operator_new(0x10,this->fMemoryManager);
        XercesLocationPath::XercesLocationPath
                  (pXVar14,(RefVectorOf<xercesc_4_0::XercesStep> *)local_140);
        uVar18 = 0;
        do {
          pBVar2 = &this->fLocationPaths->super_BaseRefVectorOf<xercesc_4_0::XercesLocationPath>;
          if (pBVar2->fCurCount <= uVar18) {
            BaseRefVectorOf<xercesc_4_0::XercesLocationPath>::addElement(pBVar2,pXVar14);
            goto LAB_003040f1;
          }
          pXVar15 = BaseRefVectorOf<xercesc_4_0::XercesLocationPath>::elementAt(pBVar2,uVar18);
          bVar5 = XercesLocationPath::operator==(pXVar15,pXVar14);
          uVar18 = uVar18 + 1;
        } while (!bVar5);
        (*(pXVar14->super_XSerializable)._vptr_XSerializable[1])(pXVar14);
LAB_003040f1:
        local_140 = (BaseRefVectorOf<xercesc_4_0::XercesStep> *)
                    XMemory::operator_new(0x30,this->fMemoryManager);
        RefVectorOf<xercesc_4_0::XercesStep>::RefVectorOf
                  ((RefVectorOf<xercesc_4_0::XercesStep> *)local_140,0x10,true,this->fMemoryManager)
        ;
        bVar4 = true;
        break;
      default:
        if (iVar6 == 0x23) {
          uVar18 = getAt + 1;
          goto switchD_00303cdd_caseD_6;
        }
        if (iVar6 == 0x24) {
          if (getAt == XVar9 - 2) {
            pXVar16 = (XPathException *)__cxa_allocate_exception(0x30);
            XPathException::XPathException
                      (pXVar16,
                       "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/identity/XercesXPath.cpp"
                       ,0x218,XPath_ExpectedStep1,this->fMemoryManager);
            goto LAB_00304710;
          }
          getAt = getAt + 1;
          goto LAB_00303e4e;
        }
      }
      bVar5 = bVar4;
      getAt = getAt_00 + 1;
    }
    if (local_140->fCurCount == 0) {
      if ((this->fLocationPaths == (RefVectorOf<xercesc_4_0::XercesLocationPath> *)0x0) ||
         ((this->fLocationPaths->super_BaseRefVectorOf<xercesc_4_0::XercesLocationPath>).fCurCount
          == 0)) {
        pXVar16 = (XPathException *)__cxa_allocate_exception(0x30);
        XPathException::XPathException
                  (pXVar16,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/identity/XercesXPath.cpp"
                   ,0x295,XPath_EmptyExpr,this->fMemoryManager);
      }
      else {
        pXVar16 = (XPathException *)__cxa_allocate_exception(0x30);
        XPathException::XPathException
                  (pXVar16,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/identity/XercesXPath.cpp"
                   ,0x298,XPath_NoUnionAtEnd,this->fMemoryManager);
      }
      __cxa_throw(pXVar16,&XPathException::typeinfo,XMLException::~XMLException);
    }
    pXVar13 = BaseRefVectorOf<xercesc_4_0::XercesStep>::elementAt(local_140,0);
    if (pXVar13->fAxisType != 3) {
      pXVar12 = (XercesNodeTest *)XMemory::operator_new(0x18,this->fMemoryManager);
      XercesNodeTest::XercesNodeTest(pXVar12,3,this->fMemoryManager);
      pXVar13 = (XercesStep *)XMemory::operator_new(0x18,this->fMemoryManager);
      XercesStep::XercesStep(pXVar13,3,pXVar12);
      BaseRefVectorOf<xercesc_4_0::XercesStep>::insertElementAt(local_140,pXVar13,0);
    }
    pXVar14 = (XercesLocationPath *)XMemory::operator_new(0x10,this->fMemoryManager);
    XercesLocationPath::XercesLocationPath
              (pXVar14,(RefVectorOf<xercesc_4_0::XercesStep> *)local_140);
    uVar18 = 0;
    do {
      pBVar2 = &this->fLocationPaths->super_BaseRefVectorOf<xercesc_4_0::XercesLocationPath>;
      if (pBVar2->fCurCount <= uVar18) {
        BaseRefVectorOf<xercesc_4_0::XercesLocationPath>::addElement(pBVar2,pXVar14);
        goto LAB_00304446;
      }
      pXVar15 = BaseRefVectorOf<xercesc_4_0::XercesLocationPath>::elementAt(pBVar2,uVar18);
      bVar5 = XercesLocationPath::operator==(pXVar15,pXVar14);
      uVar18 = uVar18 + 1;
    } while (!bVar5);
    (*(pXVar14->super_XSerializable)._vptr_XSerializable[1])(pXVar14);
LAB_00304446:
    ValueVectorOf<int>::~ValueVectorOf(&tokens);
  }
  return;
}

Assistant:

void XercesXPath::parseExpression(XMLStringPool* const stringPool,
                                  XercesNamespaceResolver* const scopeContext) {

    XMLSize_t length = XMLString::stringLen(fExpression);

    if (!length) {
        return;
    }

    ValueVectorOf<int>                tokens(16, fMemoryManager);
    XPathScannerForSchema             scanner(stringPool);
    if(!scanner.scanExpression(fExpression, 0, length, &tokens))
        ThrowXMLwithMemMgr(XPathException, XMLExcepts::XPath_TokenNotSupported, fMemoryManager);

    bool                              firstTokenOfLocationPath=true;
    XMLSize_t                         tokenCount = tokens.size();
    RefVectorOf<XercesStep>*          stepsVector = new (fMemoryManager) RefVectorOf<XercesStep>(16, true, fMemoryManager);
    Janitor<RefVectorOf<XercesStep> > janSteps(stepsVector);

    if (tokenCount) {
        fLocationPaths = new (fMemoryManager) RefVectorOf<XercesLocationPath>(8, true, fMemoryManager);
    }

    for (XMLSize_t i = 0; i < tokenCount; i++) {

        int  aToken = tokens.elementAt(i);
        bool isNamespace=false;

        switch (aToken) {
        case  XercesXPath::EXPRTOKEN_OPERATOR_UNION:
            {
                if (i == 0) {
                    ThrowXMLwithMemMgr(XPathException, XMLExcepts::XPath_NoUnionAtStart, fMemoryManager);
                }

                XMLSize_t stepsSize = stepsVector->size();

                if (stepsSize == 0) {
                    ThrowXMLwithMemMgr(XPathException, XMLExcepts::XPath_NoMultipleUnion, fMemoryManager);
                }

                if(stepsVector->elementAt(0)->getAxisType()!=XercesStep::AxisType_SELF)
                {
                    // prepend ./
                    XercesNodeTest* nodeTest = new (fMemoryManager) XercesNodeTest(XercesNodeTest::NodeType_NODE, fMemoryManager);
                    XercesStep* step = new (fMemoryManager) XercesStep(XercesStep::AxisType_SELF, nodeTest);
                    stepsVector->insertElementAt(step, 0);
                }
                XercesLocationPath* newPath = new (fMemoryManager) XercesLocationPath(stepsVector);
                janSteps.orphan();
                bool bFound=false;
                for(XMLSize_t i=0;i<fLocationPaths->size();i++)
                    if((*(fLocationPaths->elementAt(i)))==(*newPath))
                    {
                        bFound=true;
                        break;
                    }
                if(bFound)
                    delete newPath;
                else
                    fLocationPaths->addElement(newPath);
                stepsVector = new (fMemoryManager) RefVectorOf<XercesStep>(16, true, fMemoryManager);
                janSteps.reset(stepsVector);
                firstTokenOfLocationPath = true;
            }
            break;
        case XercesXPath::EXPRTOKEN_AXISNAME_ATTRIBUTE:
            {
                // consume "::" token and drop through
                i++;
            }
        case XercesXPath::EXPRTOKEN_ATSIGN:
            {
                // consume QName token
                if (i == tokenCount - 1) {
                    ThrowXMLwithMemMgr(XPathException, XMLExcepts::XPath_MissingAttr, fMemoryManager);
                }

                aToken = tokens.elementAt(++i);

                if (aToken != XercesXPath::EXPRTOKEN_NAMETEST_QNAME
                    && aToken!= XercesXPath::EXPRTOKEN_NAMETEST_ANY
                    && aToken!= XercesXPath::EXPRTOKEN_NAMETEST_NAMESPACE) {
                        ThrowXMLwithMemMgr(XPathException, XMLExcepts::XPath_ExpectedToken1, fMemoryManager);
                }

                bool isNamespaceAtt=false;

                switch (aToken) {

                case XercesXPath::EXPRTOKEN_NAMETEST_ANY:
                    {
                        XercesNodeTest* nodeTest = new (fMemoryManager) XercesNodeTest(XercesNodeTest::NodeType_WILDCARD, fMemoryManager);
                        XercesStep* step = new (fMemoryManager) XercesStep(XercesStep::AxisType_ATTRIBUTE, nodeTest);
                        stepsVector->addElement(step);
                        break;
                    }
                case XercesXPath::EXPRTOKEN_NAMETEST_NAMESPACE:
                    {
                        isNamespaceAtt = true;
                    }
                case XercesXPath::EXPRTOKEN_NAMETEST_QNAME:
                    {
                        aToken = tokens.elementAt(++i);

                        const XMLCh* prefix = XMLUni::fgZeroLenString;
                        unsigned int uri = fEmptyNamespaceId;

                        if (scopeContext && aToken != -1) {

                            prefix = stringPool->getValueForId(aToken);
                            uri = scopeContext->getNamespaceForPrefix(prefix);
                        }

                        if (aToken != -1 && scopeContext && uri == fEmptyNamespaceId) {
                            ThrowXMLwithMemMgr1(XPathException, XMLExcepts::XPath_PrefixNoURI, prefix, fMemoryManager);
                        }

                        if (isNamespaceAtt) {

                            // build step
                            XercesNodeTest* nodeTest = new (fMemoryManager) XercesNodeTest(prefix, uri, fMemoryManager);
                            XercesStep* step = new (fMemoryManager) XercesStep(XercesStep::AxisType_ATTRIBUTE, nodeTest);
                            stepsVector->addElement(step);
                            break;
                        }

                        aToken = tokens.elementAt(++i);

                        const XMLCh* localPart = stringPool->getValueForId(aToken);
                        QName aQName(prefix, localPart, uri, fMemoryManager);

                        // build step
                        XercesNodeTest* nodeTest = new (fMemoryManager) XercesNodeTest(&aQName);
                        XercesStep* step = new (fMemoryManager) XercesStep(XercesStep::AxisType_ATTRIBUTE, nodeTest);
                        stepsVector->addElement(step);
                        break;
                    }
				}

                firstTokenOfLocationPath=false;
                break;
            }
        case XercesXPath::EXPRTOKEN_DOUBLE_COLON:
            {
                // should never have a bare double colon
                ThrowXMLwithMemMgr(XPathException, XMLExcepts::XPath_NoDoubleColon, fMemoryManager);
            }
        case XercesXPath::EXPRTOKEN_AXISNAME_CHILD:
            {
                // consume "::" token and drop through
                i++;

                if (i == tokenCount - 1) {
                    ThrowXMLwithMemMgr(XPathException, XMLExcepts::XPath_ExpectedStep1, fMemoryManager);
                }

                firstTokenOfLocationPath=false;
                break;
            }
        case XercesXPath::EXPRTOKEN_NAMETEST_ANY:
            {
                XercesNodeTest* nodeTest = new (fMemoryManager) XercesNodeTest(XercesNodeTest::NodeType_WILDCARD, fMemoryManager);
                XercesStep* step = new (fMemoryManager) XercesStep(XercesStep::AxisType_CHILD, nodeTest);
                stepsVector->addElement(step);
                firstTokenOfLocationPath = false;
                break;
            }
        case XercesXPath::EXPRTOKEN_NAMETEST_NAMESPACE:
            {
                isNamespace=true;
            }
        case XercesXPath::EXPRTOKEN_NAMETEST_QNAME:
            {
                // consume QName token
                aToken = tokens.elementAt(++i);

                const XMLCh* prefix = XMLUni::fgZeroLenString;
                unsigned int uri = fEmptyNamespaceId;

                if (scopeContext && aToken != -1) {

                    prefix = stringPool->getValueForId(aToken);
                    uri = scopeContext->getNamespaceForPrefix(prefix);
                }

                if (aToken != -1 && scopeContext && uri == fEmptyNamespaceId) {
                    ThrowXMLwithMemMgr1(XPathException, XMLExcepts::XPath_PrefixNoURI, prefix, fMemoryManager);
                }

                if (isNamespace) {

                    // build step
                    XercesNodeTest* nodeTest = new (fMemoryManager) XercesNodeTest(prefix, uri, fMemoryManager);
                    XercesStep* step = new (fMemoryManager) XercesStep(XercesStep::AxisType_CHILD, nodeTest);
                    stepsVector->addElement(step);
                    break;
                }

                aToken = tokens.elementAt(++i);
                const XMLCh* localPart = stringPool->getValueForId(aToken);
                QName aQName(prefix, localPart, uri, fMemoryManager);

                // build step
                XercesNodeTest* nodeTest = new (fMemoryManager) XercesNodeTest(&aQName);
                XercesStep* step = new (fMemoryManager) XercesStep(XercesStep::AxisType_CHILD, nodeTest);
                stepsVector->addElement(step);
                firstTokenOfLocationPath = false;
                break;
            }
        case XercesXPath::EXPRTOKEN_PERIOD:
            {
                // build step
                XercesNodeTest* nodeTest = new (fMemoryManager) XercesNodeTest(XercesNodeTest::NodeType_NODE, fMemoryManager);
                XercesStep* step = new (fMemoryManager) XercesStep(XercesStep::AxisType_SELF, nodeTest);
                stepsVector->addElement(step);

                if (firstTokenOfLocationPath && i+1 < tokenCount) {

                    aToken = tokens.elementAt(i+1);

                    if (aToken == XercesXPath::EXPRTOKEN_OPERATOR_DOUBLE_SLASH){

                        if (++i == tokenCount - 1) {
                            ThrowXMLwithMemMgr(XPathException, XMLExcepts::XPath_ExpectedStep2, fMemoryManager);
                        }

                        if (i+1 < tokenCount)	{

                            aToken = tokens.elementAt(i+1);

                            if (aToken == XercesXPath::EXPRTOKEN_OPERATOR_SLASH) {
                                ThrowXMLwithMemMgr(XPathException, XMLExcepts::XPath_NoForwardSlash, fMemoryManager);
                            }
                        }
                        // build step
                        nodeTest = new (fMemoryManager) XercesNodeTest(XercesNodeTest::NodeType_NODE, fMemoryManager);
                        step = new (fMemoryManager) XercesStep(XercesStep::AxisType_DESCENDANT, nodeTest);
                        stepsVector->addElement(step);
                    }
                }
                firstTokenOfLocationPath=false;
                break;
            }
        case XercesXPath::EXPRTOKEN_OPERATOR_DOUBLE_SLASH:
            {
                ThrowXMLwithMemMgr(XPathException, XMLExcepts::XPath_NoDoubleForwardSlash, fMemoryManager);
            }
        case XercesXPath::EXPRTOKEN_OPERATOR_SLASH:
            {
                if (i == 0) {
                    ThrowXMLwithMemMgr(XPathException, XMLExcepts::XPath_NoForwardSlashAtStart, fMemoryManager);
                }

                // keep on truckin'
                if (firstTokenOfLocationPath) {
                    ThrowXMLwithMemMgr(XPathException, XMLExcepts::XPath_NoSelectionOfRoot, fMemoryManager);
                }

                if (i == tokenCount - 1) {
                    ThrowXMLwithMemMgr(XPathException, XMLExcepts::XPath_ExpectedStep3, fMemoryManager);
                }

                aToken = tokens.elementAt(i+1);
                if(aToken == XercesXPath::EXPRTOKEN_OPERATOR_SLASH || aToken == XercesXPath::EXPRTOKEN_OPERATOR_DOUBLE_SLASH || aToken == XercesXPath::EXPRTOKEN_OPERATOR_UNION)
                    ThrowXMLwithMemMgr(XPathException, XMLExcepts::XPath_ExpectedStep3, fMemoryManager);

                firstTokenOfLocationPath=false;
                break;
            }
        default:
            firstTokenOfLocationPath=false;
        }
    }

    XMLSize_t stepsSize = stepsVector->size();

    if (stepsSize == 0) {
        if (!fLocationPaths || fLocationPaths->size() == 0) {
            ThrowXMLwithMemMgr(XPathException, XMLExcepts::XPath_EmptyExpr, fMemoryManager);
        }
        else {
            ThrowXMLwithMemMgr(XPathException, XMLExcepts::XPath_NoUnionAtEnd, fMemoryManager);
        }
    }

    if(stepsVector->elementAt(0)->getAxisType()!=XercesStep::AxisType_SELF)
    {
        // prepend ./
        XercesNodeTest* nodeTest = new (fMemoryManager) XercesNodeTest(XercesNodeTest::NodeType_NODE, fMemoryManager);
        XercesStep* step = new (fMemoryManager) XercesStep(XercesStep::AxisType_SELF, nodeTest);
        stepsVector->insertElementAt(step, 0);
    }
    XercesLocationPath* newPath = new (fMemoryManager) XercesLocationPath(stepsVector);
    janSteps.orphan();
    bool bFound=false;
    for(XMLSize_t j=0;j<fLocationPaths->size();j++)
        if((*(fLocationPaths->elementAt(j)))==(*newPath))
        {
            bFound=true;
            break;
        }
    if(bFound)
        delete newPath;
    else
        fLocationPaths->addElement(newPath);
}